

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O3

bool GetPubKey(SigningProvider *provider,SignatureData *sigdata,CKeyID *address,CPubKey *pubkey)

{
  int iVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  _Base_ptr *__return_storage_ptr__;
  long in_FS_OFFSET;
  _Base_ptr local_69 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          ::find(&(sigdata->signatures)._M_t,address);
  if ((_Rb_tree_header *)cVar2._M_node == &(sigdata->signatures)._M_t._M_impl.super__Rb_tree_header)
  {
    cVar2._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
         ::find(&(sigdata->misc_pubkeys)._M_t,address);
    if ((_Rb_tree_header *)cVar2._M_node !=
        &(sigdata->misc_pubkeys)._M_t._M_impl.super__Rb_tree_header) goto LAB_00daacb5;
    cVar3 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_XOnlyPubKey>,_std::_Select1st<std::pair<const_CKeyID,_XOnlyPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_XOnlyPubKey>_>_>
            ::find(&(sigdata->tap_pubkeys)._M_t,address);
    if ((_Rb_tree_header *)cVar3._M_node ==
        &(sigdata->tap_pubkeys)._M_t._M_impl.super__Rb_tree_header) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        iVar1 = (*provider->_vptr_SigningProvider[4])(provider,address,pubkey);
        return SUB41(iVar1,0);
      }
      goto LAB_00daad51;
    }
    __return_storage_ptr__ = local_69;
    XOnlyPubKey::GetEvenCorrespondingCPubKey
              ((CPubKey *)__return_storage_ptr__,
               (XOnlyPubKey *)((long)&cVar3._M_node[1]._M_left + 4));
  }
  else {
LAB_00daacb5:
    __return_storage_ptr__ = &cVar2._M_node[1]._M_right;
  }
  memcpy(pubkey,__return_storage_ptr__,0x41);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return true;
  }
LAB_00daad51:
  __stack_chk_fail();
}

Assistant:

static bool GetPubKey(const SigningProvider& provider, const SignatureData& sigdata, const CKeyID& address, CPubKey& pubkey)
{
    // Look for pubkey in all partial sigs
    const auto it = sigdata.signatures.find(address);
    if (it != sigdata.signatures.end()) {
        pubkey = it->second.first;
        return true;
    }
    // Look for pubkey in pubkey lists
    const auto& pk_it = sigdata.misc_pubkeys.find(address);
    if (pk_it != sigdata.misc_pubkeys.end()) {
        pubkey = pk_it->second.first;
        return true;
    }
    const auto& tap_pk_it = sigdata.tap_pubkeys.find(address);
    if (tap_pk_it != sigdata.tap_pubkeys.end()) {
        pubkey = tap_pk_it->second.GetEvenCorrespondingCPubKey();
        return true;
    }
    // Query the underlying provider
    return provider.GetPubKey(address, pubkey);
}